

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

char * __thiscall Potassco::SmodelsConvert::getName(SmodelsConvert *this,Atom_t a)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  uVar1 = (this->data_->symTab_)._M_h._M_bucket_count;
  uVar3 = (ulong)a % uVar1;
  p_Var4 = (this->data_->symTab_)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, *(Atom_t *)&p_Var4->_M_nxt[1]._M_nxt != a)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, *(uint *)&p_Var2[1]._M_nxt == a)) goto LAB_0010f054;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0010f054:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var5->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    return (char *)0x0;
  }
  return (char *)p_Var2[2]._M_nxt;
}

Assistant:

const char* SmodelsConvert::getName(Atom_t a) const {
	SymTab::iterator it = data_->symTab_.find(a);
	return it != data_->symTab_.end() ? it->second : 0;
}